

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O1

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::flush_bits(packed_gamma_file3<unsigned_int,_6UL> *this)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong *puVar5;
  int iVar6;
  int iVar7;
  uint8_t x;
  byte local_39;
  ofstream *local_38;
  
  uVar4 = (this->bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if ((uVar4 & 7) != 0) {
    do {
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->bits,false);
      uVar4 = (this->bits).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    } while ((uVar4 & 7) != 0);
  }
  puVar5 = (this->bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar1 = (this->bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  local_39 = 0;
  if (puVar5 != puVar1 || uVar4 != 0) {
    local_38 = &this->out;
    iVar7 = 0;
    uVar3 = 0;
    do {
      local_39 = local_39 |
                 ((*puVar5 >> (uVar3 & 0x3f) & 1) != 0) << ((byte)(7 - (char)iVar7) & 0x1f);
      if (iVar7 == 7) {
        std::ostream::write((char *)local_38,(long)&local_39);
        local_39 = 0;
        this->actual_bitsize = this->actual_bitsize + 8;
      }
      uVar2 = iVar7 + 8;
      if (-1 < (int)(iVar7 + 1U)) {
        uVar2 = iVar7 + 1U;
      }
      iVar7 = (iVar7 + 1) - (uVar2 & 0xfffffff8);
      iVar6 = (int)uVar3;
      puVar5 = puVar5 + (iVar6 == 0x3f);
      uVar3 = (ulong)(iVar6 + 1);
      if (iVar6 == 0x3f) {
        uVar3 = 0;
      }
    } while ((uint)uVar3 != uVar4 || puVar5 != puVar1);
  }
  return;
}

Assistant:

void flush_bits(){

		//add padding
		while(bits.size()%8!=0) bits.push_back(0);

		int n = bits.size();
		int i = 0;
		uint8_t x = 0;

		for(auto b : bits){

			x |= (uint8_t(b) << (7-i));

			if(i==7){ //we just pushed last bit of a Byte

				out.write((char*)&x,1);
				x = 0;

				actual_bitsize += 8;

			}

			i = (i+1)%8;

		}

	}